

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_OnlyModelInputs(void)

{
  NetworkUpdateParameters *pNVar1;
  bool bVar2;
  ModelDescription *this;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  FeatureType *this_01;
  ostream *poVar3;
  Result local_1b0;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInputTarget;
  undefined1 local_170 [48];
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  set<long,_std::less<long>,_std::allocator<long>_> local_118;
  set<long,_std::less<long>,_std::allocator<long>_> local_e8;
  CategoricalCrossEntropyLossLayer *local_b8;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_57e1f;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_57e36;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)&tensorAttributesOut.dimension,
             (TensorAttributes *)&neuralNet,0x400,false,false);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  updateParams = (NetworkUpdateParameters *)
                 CoreML::Specification::Model::mutable_neuralnetwork((Model *)(local_68 + 0x28));
  addSoftmaxLayer((Model *)(local_68 + 0x28),"softmax","OutTensor","softmax_out");
  lossLayer = (LossLayer *)
              CoreML::Specification::NeuralNetwork::mutable_updateparams
                        ((NeuralNetwork *)updateParams);
  ceLossLayer = (CategoricalCrossEntropyLossLayer *)
                CoreML::Specification::NetworkUpdateParameters::add_losslayers
                          ((NetworkUpdateParameters *)lossLayer);
  CoreML::Specification::LossLayer::set_name((LossLayer *)ceLossLayer,"cross_entropy_loss_layer");
  local_b8 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                       ((LossLayer *)ceLossLayer);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(local_b8,"softmax_out");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(local_b8,"target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)updateParams,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = updateParams;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_e8._M_t._M_impl._0_8_ = 0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_e8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,kSgdOptimizer,10,5,100,&local_e8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_e8);
  pNVar1 = updateParams;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_118._M_t._M_impl._0_8_ = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_118);
  addEpochs<CoreML::Specification::NeuralNetwork>((NeuralNetwork *)pNVar1,100,1,100,&local_118);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_118);
  pNVar1 = updateParams;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_170[0x28] = '\0';
  local_170[0x29] = '\0';
  local_170[0x2a] = '\0';
  local_170[0x2b] = '\0';
  local_170[0x2c] = '\0';
  local_170[0x2d] = '\0';
  local_170[0x2e] = '\0';
  local_170[0x2f] = '\0';
  uStack_140 = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)(local_170 + 0x28));
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)(local_170 + 0x28));
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)(local_170 + 0x28));
  CoreML::Model::validate((Result *)local_170,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,(Result *)local_170);
  CoreML::Result::~Result((Result *)local_170);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x59d);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    this = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    this_00 = CoreML::Specification::ModelDescription::mutable_traininginput(this);
    trainingInputTensorShape =
         (ArrayFeatureType *)
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(this_00)
    ;
    CoreML::Specification::FeatureDescription::set_name
              ((FeatureDescription *)trainingInputTensorShape,"target");
    this_01 = CoreML::Specification::FeatureDescription::mutable_type
                        ((FeatureDescription *)trainingInputTensorShape);
    local_1b0.m_message._M_storage._M_storage =
         (uchar  [8])CoreML::Specification::FeatureType::mutable_multiarraytype(this_01);
    CoreML::Specification::ArrayFeatureType::set_datatype
              ((ArrayFeatureType *)local_1b0.m_message._M_storage._M_storage,
               ArrayFeatureType_ArrayDataType_INT32);
    CoreML::Specification::ArrayFeatureType::add_shape
              ((ArrayFeatureType *)local_1b0.m_message._M_storage._M_storage,1);
    CoreML::Model::validate(&local_1b0,(Model *)(local_68 + 0x28));
    CoreML::Result::operator=((Result *)local_68,&local_1b0);
    CoreML::Result::~Result(&local_1b0);
    bVar2 = CoreML::Result::good((Result *)local_68);
    if (bVar2) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5a7);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(res).good()");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  trainingInputTarget._4_4_ = 1;
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_OnlyModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("softmax_out");
    ceLossLayer->set_target("target");

    // Not clearing training inputs or explicitly adding model inputs as buildBasicNeuralNetworkModel() adds model inputs to training inputs

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add target to training inputs
    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}